

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Node::EndAscii(Node *this,ostream *s,int indent,bool has_children)

{
  undefined3 in_register_00000009;
  int iVar1;
  
  if (CONCAT31(in_register_00000009,has_children) == 0) {
    return;
  }
  std::operator<<(s,'\n');
  iVar1 = 0;
  if (0 < indent) {
    iVar1 = indent;
  }
  while (iVar1 != 0) {
    std::operator<<(s,'\t');
    iVar1 = iVar1 + -1;
  }
  std::operator<<(s,"}");
  return;
}

Assistant:

void FBX::Node::EndAscii(std::ostream& s, int indent, bool has_children)
{
    if (!has_children) { return; } // nothing to do
    s << '\n';
    for (int i = 0; i < indent; ++i) { s << '\t'; }
    s << "}";
}